

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_controller_io.h
# Opt level: O1

uint8_t __thiscall
n_e_s::core::MemBankControllerIO::read_byte(MemBankControllerIO *this,uint16_t addr)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  INesController *pIVar4;
  
  if (this->controller1_addr_ == addr) {
    pIVar4 = this->controller1_;
    bVar2 = this->read_cnt1_;
    this->read_cnt1_ = bVar2 + 1;
  }
  else {
    if (this->controller2_addr_ != addr) {
      return '\0';
    }
    pIVar4 = this->controller2_;
    bVar2 = this->read_cnt2_;
    this->read_cnt2_ = bVar2 + 1;
  }
  uVar3 = 0;
  if ((this->data1_ & 1) == 0) {
    if (7 < bVar2) {
      return 'A';
    }
    uVar3 = (ulong)bVar2;
  }
  iVar1 = (*pIVar4->_vptr_INesController[3])(pIVar4,uVar3);
  return (byte)iVar1 | 0x40;
}

Assistant:

uint8_t read_byte(uint16_t addr) const override {
        // Source: https://wiki.nesdev.com/w/index.php/Standard_controller
        // In the NES and Famicom, the top three (or five) bits are not
        // driven, and so retain the bits of the previous byte on the bus.
        // Usually this is the most significant byte of the address of the
        // controller port—0x40. Certain games (such as Paperboy) rely on
        // this behavior and require that reads from the controller ports
        // return exactly $40 or $41 as appropriate.

        INesController *controller{};
        uint8_t read_cnt{0};

        if (addr == controller1_addr_) {
            controller = controller1_;
            read_cnt = read_cnt1_++;
        } else if (addr == controller2_addr_) {
            controller = controller2_;
            read_cnt = read_cnt2_++;
        } else {
            return 0x00;
        }

        uint8_t data = 0x40;
        uint8_t btn = 0x00;

        // Special case, if strobe (0x4016, bit 1) is high, always return button
        // A for each controller
        if ((data1_ & static_cast<uint8_t>(0x01)) == 0x01) {
            btn = controller->get(INesController::Button::A) ? 0x01 : 0x00;
            return static_cast<uint8_t>(data & static_cast<uint8_t>(0xFE)) |
                   btn;
        }

        switch (read_cnt) {
        case 0:
            btn = controller->get(INesController::Button::A) ? 0x01 : 0x00;
            break;
        case 1:
            btn = controller->get(INesController::Button::B) ? 0x01 : 0x00;
            break;
        case 2:
            btn = controller->get(INesController::Button::Select) ? 0x01 : 0x00;
            break;
        case 3:
            btn = controller->get(INesController::Button::Start) ? 0x01 : 0x00;
            break;
        case 4:
            btn = controller->get(INesController::Button::Up) ? 0x01 : 0x00;
            break;
        case 5:
            btn = controller->get(INesController::Button::Down) ? 0x01 : 0x00;
            break;
        case 6:
            btn = controller->get(INesController::Button::Left) ? 0x01 : 0x00;
            break;
        case 7:
            btn = controller->get(INesController::Button::Right) ? 0x01 : 0x00;
            break;
        default:
            btn = 0x01; // After 8th read, return 1 for official Nintendo
                        // controllers
        }
        data = static_cast<uint8_t>(data & static_cast<uint8_t>(0xFE)) | btn;
        return data;
    }